

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_fma::forward_int8_x86
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  _func_int *p_Var2;
  Layer *pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  int i;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  pointer piVar25;
  undefined1 *puVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  void *pvVar31;
  undefined8 *puVar32;
  long lVar33;
  ulong uVar34;
  int i_1;
  uint uVar35;
  int i_3;
  int iVar36;
  pointer piVar37;
  int iVar38;
  uint uVar39;
  undefined1 *puVar40;
  ulong uVar41;
  int iVar42;
  undefined1 *puVar43;
  int outw;
  void *pvVar44;
  ulong uVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  int w_1;
  int w_2;
  int w;
  Option opt_q;
  void *local_208;
  allocator_type local_1f9;
  pointer local_1f8;
  void *local_1f0;
  void *local_1e8;
  Mat *local_1e0;
  pointer local_1d8;
  void *local_1d0;
  Convolution_x86_fma *local_1c8;
  undefined1 *local_1c0;
  Option *local_1b8;
  Mat *local_1b0;
  ulong local_1a8;
  Mat *local_1a0;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  size_t local_158;
  Mat local_148;
  Mat local_f8;
  ulong local_b0;
  undefined1 *local_a8;
  Mat *local_a0;
  void *local_98;
  int local_8c;
  undefined1 local_88 [56];
  int local_50;
  size_t local_48;
  long local_40;
  void *local_38;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  
  local_88._24_4_ = bottom_blob->elempack;
  if (local_88._24_4_ == 0) {
    bVar46 = false;
  }
  else {
    bVar46 = ((int)bottom_blob->elemsize << 3) / (int)local_88._24_4_ == 8;
  }
  piVar1 = bottom_blob->refcount;
  local_88._0_8_ = bottom_blob->data;
  local_88._8_4_ = SUB84(bottom_blob->refcount,0);
  local_88._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_88._16_8_ = bottom_blob->elemsize;
  local_88._32_8_ = bottom_blob->allocator;
  local_88._40_4_ = bottom_blob->dims;
  local_88._44_4_ = bottom_blob->w;
  local_88._48_4_ = bottom_blob->h;
  local_88._52_4_ = bottom_blob->d;
  local_50 = bottom_blob->c;
  local_48 = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_1b8 = opt;
  if (!bVar46) {
    local_198._0_8_ = *(undefined8 *)opt;
    local_198._16_8_ = opt->workspace_allocator;
    uVar11 = opt->openmp_blocktime;
    uVar12 = opt->use_winograd_convolution;
    uVar14 = opt->use_sgemm_convolution;
    uVar16 = opt->use_int8_inference;
    uVar18 = opt->use_vulkan_compute;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    local_178[0] = opt->use_bf16_storage;
    local_178[1] = opt->use_fp16_packed;
    local_178[2] = opt->use_fp16_storage;
    local_178[3] = opt->use_fp16_arithmetic;
    local_178[4] = opt->use_int8_packed;
    local_178[5] = opt->use_int8_storage;
    local_178[6] = opt->use_int8_arithmetic;
    local_178[7] = opt->use_packing_layout;
    local_178[8] = opt->use_shader_pack8;
    local_178[9] = opt->use_subgroup_basic;
    local_178[10] = opt->use_subgroup_vote;
    local_178[0xb] = opt->use_subgroup_ballot;
    local_178[0xc] = opt->use_subgroup_shuffle;
    local_178[0xd] = opt->use_image_storage;
    local_178[0xe] = opt->use_tensor_storage;
    local_178[0xf] = opt->use_reserved_0;
    local_178._16_4_ = opt->flush_denormals;
    local_178[0x14] = opt->use_local_pool_allocator;
    local_178[0x15] = opt->use_shader_local_memory;
    local_178[0x16] = opt->use_cooperative_matrix;
    local_178[0x17] = opt->use_winograd23_convolution;
    local_178[0x18] = opt->use_winograd43_convolution;
    local_178[0x19] = opt->use_winograd63_convolution;
    local_178[0x1a] = opt->use_reserved_6;
    local_178[0x1b] = opt->use_reserved_7;
    local_178[0x1c] = opt->use_reserved_8;
    local_178[0x1d] = opt->use_reserved_9;
    local_178[0x1e] = opt->use_reserved_10;
    local_178[0x1f] = opt->use_reserved_11;
    local_198._8_4_ = SUB84(opt->workspace_allocator,0);
    local_198._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_198._24_4_ = uVar11;
    local_198._28_4_ = uVar13;
    quantize_to_int8(bottom_blob,(Mat *)local_88,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_fma[-3]),
                     (Option *)local_198);
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_1c8 = this;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_fma + (long)this->_vptr_Convolution_x86_fma[-3]),
             (Mat *)local_88,&local_148,local_1b8);
  iVar24 = -100;
  if ((local_148.data == (void *)0x0) || ((long)local_148.c * local_148.cstep == 0))
  goto LAB_002215ed;
  p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
  iVar42 = (~((*(int *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.w) / *(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data)
           + 1;
  iVar38 = (~((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.h) / *(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) + 1;
  local_8c = *(int *)(p_Var2 + 0x20 + (long)&(local_1c8->weight_winograd43_data).data);
  uVar35 = 1;
  if (local_1b8->use_packing_layout == true) {
    if (local_8c < 0x65) {
      uVar35 = (uint)((*(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) &
                      3) == 0) * 3 + 1;
    }
    else {
      uVar35 = 1;
      if ((*(uint *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) & 7) == 0) {
        uVar35 = 8;
      }
    }
  }
  local_1a0 = (Mat *)CONCAT44(local_1a0._4_4_,local_148.elempack);
  local_98 = (void *)CONCAT44(local_98._4_4_,local_148.c);
  uVar29 = uVar35 * 4;
  if (100 < local_8c) {
    uVar29 = uVar35;
  }
  Mat::create(top_blob,iVar42,iVar38,
              *(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) /
              (int)uVar35,(ulong)uVar29,uVar35,local_1b8->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002215ed;
  local_b0 = 1;
  if (local_1b8->use_packing_layout == true) {
    local_b0 = (ulong)((uint)(((byte)(local_1c8->_vptr_Convolution_x86_fma[-3] + 0x30)
                                     [(long)&(local_1c8->weight_winograd23_data).data] & 3) == 0) *
                       3 + 1);
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  iVar24 = (int)local_b0;
  local_a0 = top_blob;
  Mat::create(&local_f8,iVar42,iVar38,
              *(int *)(local_1c8->_vptr_Convolution_x86_fma[-3] + 0x30 +
                      (long)&(local_1c8->weight_winograd23_data).data) / iVar24,
              (ulong)(uint)(iVar24 * 4),iVar24,local_1b8->workspace_allocator);
  iVar19 = local_f8.h;
  iVar42 = local_f8.w;
  iVar38 = local_148.c;
  iVar24 = -100;
  if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
    if (((int)local_1a0 == 8) && ((int)local_b0 == 4)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
      uVar35 = *(uint *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar35 == 1) {
        if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar35 != 1) ||
               ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) != 2))))
          goto LAB_0021fa43;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_0021fa43:
        if ((((local_1b8->use_winograd_convolution == true) &&
             (((uVar35 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
              (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 3)))) &&
            (((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) &&
           (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1f8 = (pointer)(ulong)*(uint *)(p_Var2 + 0x38 +
                                               (long)&(local_1c8->weight_winograd23_data).data);
          local_1c0 = (undefined1 *)
                      (long)*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data
                                    );
          iVar24 = *(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar36 = *(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data);
          local_1d8 = (pointer)(long)*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).
                                                              data);
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,local_148.w);
          uVar34 = (ulong)(uint)local_148.c;
          puVar40 = (undefined1 *)(ulong)(uint)local_f8.w;
          pvVar31 = (void *)(ulong)(uint)local_f8.h;
          uVar29 = *(uint *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar35;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar29,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar38) {
              iVar38 = (int)local_1e8 * (int)local_1d8;
              local_1d0 = local_148.data;
              local_1d8 = (pointer)local_198._0_8_;
              local_1f0 = (void *)((long)local_148.w * (long)iVar24);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1f8) {
                  piVar37 = (pointer)(local_198._0_8_ +
                                     local_158 * (long)local_208 * local_198._16_8_);
                  local_1e8 = (void *)(local_148.elemsize * (long)local_1f0);
                  lVar27 = 0;
                  do {
                    if (0 < (int)uVar35) {
                      uVar20 = 0;
                      do {
                        if (0 < iVar19) {
                          puVar32 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar20 * (long)local_1c0 * 8 +
                                    (long)local_1e8 * lVar27 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          uVar29 = 0;
                          do {
                            puVar26 = puVar40;
                            if (0 < iVar42) {
                              do {
                                *(undefined8 *)piVar37 = *puVar32;
                                piVar37 = piVar37 + 2;
                                puVar32 = puVar32 + iVar36;
                                uVar39 = (int)puVar26 - 1;
                                puVar26 = (undefined1 *)(ulong)uVar39;
                              } while (uVar39 != 0);
                            }
                            puVar32 = puVar32 + (iVar38 - iVar42 * iVar36);
                            uVar29 = uVar29 + 1;
                          } while (uVar29 != iVar19);
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    lVar27 = lVar27 + 1;
                  } while ((pointer)lVar27 != local_1f8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar34);
            }
            im2col_sgemm_pack8to4_int8_sse((Mat *)local_198,&local_f8,local_1e0,local_1b8);
            piVar1 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if ((Allocator *)local_178._0_8_ == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_178._0_8_)[3])();
                }
              }
            }
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT828((ulong)local_178._0_8_);
          }
          else {
            local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar29,&local_1f9);
            if (0 < (int)local_1f8) {
              iVar30 = 0;
              iVar21 = 0;
              iVar23 = 0;
              do {
                if (0 < (int)uVar35) {
                  lVar27 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar30 + lVar27) * 4) = iVar21;
                    iVar21 = iVar21 + (int)local_1c0;
                    lVar27 = lVar27 + 1;
                  } while (uVar35 != (uint)lVar27);
                  iVar30 = iVar30 + (uint)lVar27;
                }
                iVar21 = iVar21 + ((int)local_1e8 * iVar24 - (int)local_1c0 * uVar35);
                iVar23 = iVar23 + 1;
              } while (iVar23 != (int)local_1f8);
            }
            if (0 < (int)local_1e0) {
              local_1d0 = (void *)((long)iVar42 * 4);
              local_208 = (void *)0x0;
              do {
                if (0 < iVar19) {
                  local_1f8 = (pointer)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                       (long)local_f8.data);
                  local_1f0 = (void *)0x0;
                  do {
                    if (0 < iVar42) {
                      local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                      puVar26 = (undefined1 *)0x0;
                      do {
                        local_1c0 = puVar26;
                        if (iVar38 < 1) {
                          auVar55 = (undefined1  [16])0x0;
                          auVar48 = (undefined1  [16])0x0;
                          auVar52 = (undefined1  [16])0x0;
                          auVar47 = (undefined1  [16])0x0;
                        }
                        else {
                          pvVar44 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                             (local_1c8->weight_data_tm).elemsize +
                                            (long)(local_1c8->weight_data_tm).data);
                          auVar49 = ZEXT1664((undefined1  [16])0x0);
                          uVar20 = 0;
                          auVar54 = ZEXT1664((undefined1  [16])0x0);
                          auVar53 = ZEXT1664((undefined1  [16])0x0);
                          auVar51 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            if (0 < (int)uVar29) {
                              lVar27 = 0;
                              do {
                                auVar55._8_8_ = 0;
                                auVar55._0_8_ =
                                     *(ulong *)((long)local_148.data +
                                               (long)*(int *)(local_198._0_8_ + lVar27) * 8 +
                                               local_148.cstep * local_148.elemsize * uVar20 +
                                               (long)(iVar36 * 8 * (int)local_1c0) +
                                               (long)local_148.w * (long)local_1e8 *
                                               local_148.elemsize);
                                auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar55);
                                auVar10 = vpunpcklbw_avx(auVar55,auVar47);
                                auVar47 = *(undefined1 (*) [16])((long)pvVar44 + lVar27 * 8);
                                auVar55 = *(undefined1 (*) [16])((long)pvVar44 + lVar27 * 8 + 0x10);
                                auVar48 = vpcmpgtb_avx((undefined1  [16])0x0,auVar47);
                                auVar52 = vpcmpgtb_avx((undefined1  [16])0x0,auVar55);
                                auVar50 = vpunpcklbw_avx(auVar47,auVar48);
                                auVar47 = vpunpckhbw_avx(auVar47,auVar48);
                                auVar48 = vpunpcklbw_avx(auVar55,auVar52);
                                auVar55 = vpunpckhbw_avx(auVar55,auVar52);
                                auVar6 = vpmullw_avx(auVar50,auVar10);
                                auVar50 = vpmulhw_avx(auVar50,auVar10);
                                auVar7 = vpmullw_avx(auVar10,auVar47);
                                auVar4 = vpmulhw_avx(auVar10,auVar47);
                                auVar8 = vpmullw_avx(auVar48,auVar10);
                                auVar5 = vpmulhw_avx(auVar48,auVar10);
                                auVar9 = vpmullw_avx(auVar10,auVar55);
                                auVar10 = vpmulhw_avx(auVar10,auVar55);
                                auVar47 = vpunpcklwd_avx(auVar6,auVar50);
                                auVar47 = vpaddd_avx(auVar49._0_16_,auVar47);
                                auVar55 = vpunpcklwd_avx(auVar7,auVar4);
                                auVar55 = vpaddd_avx(auVar54._0_16_,auVar55);
                                auVar48 = vpunpcklwd_avx(auVar8,auVar5);
                                auVar48 = vpaddd_avx(auVar53._0_16_,auVar48);
                                auVar52 = vpunpcklwd_avx(auVar9,auVar10);
                                auVar52 = vpaddd_avx(auVar51._0_16_,auVar52);
                                auVar50 = vpunpckhwd_avx(auVar6,auVar50);
                                auVar47 = vpaddd_avx(auVar47,auVar50);
                                auVar49 = ZEXT1664(auVar47);
                                auVar47 = vpunpckhwd_avx(auVar7,auVar4);
                                auVar47 = vpaddd_avx(auVar55,auVar47);
                                auVar54 = ZEXT1664(auVar47);
                                auVar47 = vpunpckhwd_avx(auVar8,auVar5);
                                auVar47 = vpaddd_avx(auVar48,auVar47);
                                auVar53 = ZEXT1664(auVar47);
                                auVar47 = vpunpckhwd_avx(auVar9,auVar10);
                                auVar47 = vpaddd_avx(auVar52,auVar47);
                                auVar51 = ZEXT1664(auVar47);
                                lVar27 = lVar27 + 4;
                              } while ((ulong)uVar29 << 2 != lVar27);
                              pvVar44 = (void *)((long)pvVar44 + (ulong)uVar29 * 0x20);
                            }
                            auVar48 = auVar53._0_16_;
                            auVar55 = auVar51._0_16_;
                            auVar52 = auVar54._0_16_;
                            auVar47 = auVar49._0_16_;
                            uVar20 = uVar20 + 1;
                          } while (uVar20 != uVar34);
                        }
                        auVar50 = vpunpckldq_avx(auVar47,auVar52);
                        auVar4 = vpunpckldq_avx(auVar48,auVar55);
                        auVar52 = vpunpckhdq_avx(auVar47,auVar52);
                        auVar55 = vpunpckhdq_avx(auVar48,auVar55);
                        auVar48 = vpunpcklqdq_avx(auVar50,auVar4);
                        auVar47 = vpunpckhqdq_avx(auVar50,auVar4);
                        auVar47 = vpaddd_avx(auVar48,auVar47);
                        auVar48 = vpunpcklqdq_avx(auVar52,auVar55);
                        auVar55 = vpunpckhqdq_avx(auVar52,auVar55);
                        auVar55 = vpaddd_avx(auVar55,auVar48);
                        auVar47 = vpaddd_avx(auVar47,auVar55);
                        *(undefined1 (*) [16])(local_1f8 + (long)local_1c0 * 4) = auVar47;
                        puVar26 = local_1c0 + 1;
                      } while (local_1c0 + 1 != puVar40);
                    }
                    local_1f8 = local_1f8 + (long)iVar42 * 4;
                    local_1f0 = (void *)((long)local_1f0 + 1);
                  } while (local_1f0 != pvVar31);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while ((Mat *)local_208 != local_1e0);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    iVar42 = local_f8.h;
    iVar38 = local_f8.w;
    iVar24 = local_148.c;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 4)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
      uVar35 = *(uint *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
      puVar40 = (undefined1 *)(ulong)uVar35;
      if (puVar40 == (undefined1 *)0x1) {
        if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)))) {
          conv1x1s1_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar35 != 1) ||
              ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                  (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) != 2))))))
          goto LAB_0022011e;
          conv1x1s2_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_0022011e:
        if (uVar35 == 3) {
          if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 3) &&
               (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 3)
                 || ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 1
                     || (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data)
                         != 1)))) ||
                (*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) != 2))
            goto LAB_002201ce;
            conv3x3s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
        }
        else {
LAB_002201ce:
          if ((((uVar35 == 7) &&
               (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 7)) &&
              (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             (((*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 2)) &&
              (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 2)))) {
            conv7x7s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            local_1f0 = (void *)(ulong)*(uint *)(p_Var2 + 0x38 +
                                                (long)&(local_1c8->weight_winograd23_data).data);
            local_1e8 = (void *)(long)*(int *)(p_Var2 + 0x3c +
                                              (long)&(local_1c8->weight_winograd23_data).data);
            local_1a8 = (ulong)*(int *)(p_Var2 + 0x40 +
                                       (long)&(local_1c8->weight_winograd23_data).data);
            iVar19 = *(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data);
            lVar27 = (long)iVar19;
            local_1d8 = (pointer)(long)*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).
                                                                data);
            local_1f8 = (pointer)CONCAT44(local_1f8._4_4_,local_148.w);
            puVar43 = (undefined1 *)(ulong)(uint)local_148.c;
            puVar26 = (undefined1 *)(long)local_f8.w;
            pvVar31 = (void *)(ulong)(uint)local_f8.h;
            uVar29 = *(uint *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) *
                     uVar35;
            if (local_1b8->use_sgemm_convolution == true) {
              local_158 = 0;
              local_198._0_8_ = (pointer)0x0;
              local_198._8_4_ = 0;
              local_198._12_4_ = 0;
              local_198._16_8_ = (Allocator *)0x0;
              local_198._24_4_ = 0;
              local_178._0_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar29,local_148.c,1,1,
                          local_1b8->workspace_allocator);
              local_1b0 = &local_1c8->weight_sgemm_data;
              if (0 < iVar24) {
                iVar24 = (int)local_1f8 * (int)local_1d8;
                local_1e0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1f0) {
                    local_1d0 = (void *)((long)local_148.data +
                                        local_148.cstep * (long)local_1e0 * local_148.elemsize);
                    piVar37 = (pointer)(local_158 * (long)local_1e0 * local_198._16_8_ +
                                       local_198._0_8_);
                    local_1d8 = (pointer)((long)local_148.w * local_148.elemsize * local_1a8);
                    pvVar31 = (void *)0x0;
                    do {
                      if (0 < (int)uVar35) {
                        local_1f8 = (pointer)((long)local_1d0 + (long)local_1d8 * (long)pvVar31);
                        lVar33 = 0;
                        do {
                          if (0 < iVar42) {
                            piVar25 = (pointer)((long)local_1f8 + lVar33 * (long)local_1e8);
                            uVar29 = 0;
                            do {
                              if (iVar38 < 4) {
                                uVar39 = 0;
                              }
                              else {
                                iVar36 = 3;
                                do {
                                  *(char *)piVar37 = (char)*piVar25;
                                  *(undefined1 *)((long)piVar37 + 1) =
                                       *(undefined1 *)((long)piVar25 + lVar27);
                                  *(undefined1 *)((long)piVar37 + 2) =
                                       *(undefined1 *)((long)piVar25 + (long)(iVar19 * 2));
                                  *(undefined1 *)((long)piVar37 + 3) =
                                       *(undefined1 *)((long)piVar25 + (long)(iVar19 * 3));
                                  piVar25 = piVar25 + lVar27;
                                  piVar37 = piVar37 + 1;
                                  iVar36 = iVar36 + 4;
                                  uVar39 = iVar38 & 0xfffffffc;
                                } while (iVar36 < iVar38);
                              }
                              uVar28 = uVar39 | 1;
                              while ((int)uVar28 < iVar38) {
                                *(char *)piVar37 = (char)*piVar25;
                                *(undefined1 *)((long)piVar37 + 1) =
                                     *(undefined1 *)((long)piVar25 + lVar27);
                                piVar25 = (pointer)((long)piVar25 + (long)(iVar19 * 2));
                                piVar37 = (pointer)((long)piVar37 + 2);
                                uVar28 = uVar39 + 3;
                                uVar39 = uVar39 + 2;
                              }
                              if ((int)uVar39 < iVar38) {
                                iVar36 = iVar38 - uVar39;
                                do {
                                  *(char *)piVar37 = (char)*piVar25;
                                  piVar25 = (pointer)((long)piVar25 + lVar27);
                                  piVar37 = (pointer)((long)piVar37 + 1);
                                  iVar36 = iVar36 + -1;
                                } while (iVar36 != 0);
                              }
                              piVar25 = (pointer)((long)piVar25 + (long)(iVar24 - iVar38 * iVar19));
                              uVar29 = uVar29 + 1;
                            } while (uVar29 != iVar42);
                          }
                          lVar33 = lVar33 + 1;
                        } while ((undefined1 *)lVar33 != puVar40);
                      }
                      pvVar31 = (void *)((long)pvVar31 + 1);
                    } while (pvVar31 != local_1f0);
                  }
                  local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                  local_1c0 = puVar40;
                } while (local_1e0 != (Mat *)puVar43);
              }
              im2col_sgemm_pack1to4_int8_sse((Mat *)local_198,&local_f8,local_1b0,local_1b8);
              piVar1 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  if ((Allocator *)local_178._0_8_ == (Allocator *)0x0) {
                    if ((pointer)local_198._0_8_ != (pointer)0x0) {
                      free((void *)local_198._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_178._0_8_)[3])();
                  }
                }
              }
              local_158 = 0;
              local_198._0_8_ = (pointer)0x0;
              local_198._8_4_ = 0;
              local_198._12_4_ = 0;
              local_198._16_8_ = (Allocator *)0x0;
              local_198._24_4_ = 0;
              local_178._0_28_ = ZEXT828((ulong)local_178._0_8_);
            }
            else {
              local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar29,&local_1f9
                        );
              if (0 < (int)local_1f0) {
                iVar19 = 0;
                iVar36 = 0;
                iVar30 = 0;
                do {
                  if (0 < (int)uVar35) {
                    lVar33 = 0;
                    do {
                      *(int *)(local_198._0_8_ + (iVar19 + lVar33) * 4) = iVar36;
                      iVar36 = iVar36 + (int)local_1e8;
                      lVar33 = lVar33 + 1;
                    } while (uVar35 != (uint)lVar33);
                    iVar19 = iVar19 + (uint)lVar33;
                  }
                  iVar36 = iVar36 + ((int)local_1f8 * (int)local_1a8 - (int)local_1e8 * uVar35);
                  iVar30 = iVar30 + 1;
                } while (iVar30 != (int)local_1f0);
              }
              if (0 < (int)local_1e0) {
                local_1d0 = (void *)((long)puVar26 * 4);
                local_208 = (void *)0x0;
                do {
                  if (0 < iVar42) {
                    local_1f8 = (pointer)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                         (long)local_f8.data);
                    local_1f0 = (void *)0x0;
                    do {
                      if (0 < iVar38) {
                        local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                        puVar40 = (undefined1 *)0x0;
                        do {
                          local_1c0 = puVar40;
                          if (iVar24 < 1) {
                            auVar47 = (undefined1  [16])0x0;
                          }
                          else {
                            pvVar44 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                               (local_1c8->weight_data_tm).elemsize +
                                              (long)(local_1c8->weight_data_tm).data);
                            auVar49 = ZEXT1664((undefined1  [16])0x0);
                            lVar33 = 0;
                            do {
                              if (0 < (int)uVar29) {
                                uVar34 = 0;
                                do {
                                  auVar47 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_148.data +
                                                  (long)*(int *)(local_198._0_8_ + uVar34 * 4) +
                                                  local_148.cstep * local_148.elemsize * lVar33 +
                                                  (long)local_1c0 * lVar27 +
                                                  (long)local_148.w * (long)local_1e8 *
                                                  local_148.elemsize)),0);
                                  auVar48 = vpshufd_avx(auVar47,0);
                                  auVar52._8_8_ = 0;
                                  auVar52._0_8_ = *(ulong *)((long)pvVar44 + uVar34 * 4);
                                  auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar52);
                                  auVar47 = vpunpcklbw_avx(auVar52,auVar47);
                                  auVar55 = vpmullw_avx(auVar48,auVar47);
                                  auVar47 = vpmulhw_avx(auVar48,auVar47);
                                  auVar47 = vpunpcklwd_avx(auVar55,auVar47);
                                  auVar47 = vpaddd_avx(auVar49._0_16_,auVar47);
                                  auVar49 = ZEXT1664(auVar47);
                                  uVar34 = uVar34 + 1;
                                } while (uVar29 != uVar34);
                                pvVar44 = (void *)((long)pvVar44 + (ulong)uVar29 * 4);
                              }
                              auVar47 = auVar49._0_16_;
                              lVar33 = lVar33 + 1;
                            } while ((undefined1 *)lVar33 != puVar43);
                          }
                          *(undefined1 (*) [16])(local_1f8 + (long)local_1c0 * 4) = auVar47;
                          puVar40 = local_1c0 + 1;
                        } while (local_1c0 + 1 != puVar26);
                      }
                      local_1f8 = local_1f8 + (long)puVar26 * 4;
                      local_1f0 = (void *)((long)local_1f0 + 1);
                    } while (local_1f0 != pvVar31);
                  }
                  local_208 = (void *)((long)local_208 + 1);
                } while ((Mat *)local_208 != local_1e0);
              }
              if ((pointer)local_198._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
              }
            }
          }
        }
      }
    }
    iVar42 = local_f8.w;
    iVar38 = local_148.c;
    iVar24 = local_148.w;
    if (((int)local_1a0 == 8) && ((int)local_b0 == 1)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
      uVar35 = *(uint *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar35 == 1) {
        if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar35 != 1) ||
              ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                  (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) != 2))))))
          goto LAB_0022087e;
          conv1x1s2_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_0022087e:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((((uVar35 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
               (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 3)) &&
              ((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
             && (*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
           && (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1e8 = (void *)(ulong)*(uint *)(p_Var2 + 0x38 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          local_1f8 = (pointer)(long)*(int *)(p_Var2 + 0x3c +
                                             (long)&(local_1c8->weight_winograd23_data).data);
          iVar19 = *(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar36 = *(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data);
          local_1a8 = (ulong)*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data);
          uVar34 = (ulong)(uint)local_148.c;
          uVar20 = (ulong)(uint)local_f8.w;
          local_1c0 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar29 = *(uint *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar35;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar29,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar38) {
              local_1d0 = local_148.data;
              local_1d8 = (pointer)local_198._0_8_;
              local_1f0 = (void *)((long)local_148.w * (long)iVar19);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1e8) {
                  piVar37 = (pointer)(local_198._0_8_ +
                                     local_158 * (long)local_208 * local_198._16_8_);
                  pvVar31 = (void *)0x0;
                  do {
                    if (0 < (int)uVar35) {
                      uVar41 = 0;
                      do {
                        if (0 < (int)local_1c0) {
                          puVar32 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar41 * (long)local_1f8 * 8 +
                                    local_148.elemsize * (long)local_1f0 * (long)pvVar31 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          iVar38 = 0;
                          do {
                            uVar22 = uVar20;
                            if (0 < iVar42) {
                              do {
                                *(undefined8 *)piVar37 = *puVar32;
                                piVar37 = piVar37 + 2;
                                puVar32 = puVar32 + iVar36;
                                uVar29 = (int)uVar22 - 1;
                                uVar22 = (ulong)uVar29;
                              } while (uVar29 != 0);
                            }
                            puVar32 = puVar32 + (iVar24 * (int)local_1a8 - iVar42 * iVar36);
                            iVar38 = iVar38 + 1;
                          } while (iVar38 != (int)local_1c0);
                        }
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar35);
                    }
                    pvVar31 = (void *)((long)pvVar31 + 1);
                  } while (pvVar31 != local_1e8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar34);
            }
            im2col_sgemm_pack8to1_int8_sse((Mat *)local_198,&local_f8,local_1e0,local_1b8);
            piVar1 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if ((Allocator *)local_178._0_8_ == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_178._0_8_)[3])();
                }
              }
            }
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT828((ulong)local_178._0_8_);
          }
          else {
            local_a8 = (undefined1 *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(long)(int)uVar29,&local_1f9);
            if (0 < (int)local_1e8) {
              iVar30 = 0;
              iVar21 = 0;
              iVar23 = 0;
              do {
                if (0 < (int)uVar35) {
                  lVar27 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar30 + lVar27) * 4) = iVar21;
                    iVar21 = iVar21 + (int)local_1f8;
                    lVar27 = lVar27 + 1;
                  } while (uVar35 != (uint)lVar27);
                  iVar30 = iVar30 + (uint)lVar27;
                }
                iVar21 = iVar21 + (iVar24 * iVar19 - (int)local_1f8 * uVar35);
                iVar23 = iVar23 + 1;
              } while (iVar23 != (int)local_1e8);
            }
            if (0 < (int)local_a8) {
              local_1e0 = (Mat *)(long)iVar42;
              local_38 = local_f8.data;
              local_40 = local_f8.elemsize * local_f8.cstep;
              local_1f8 = (pointer)((ulong)uVar29 * 8);
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)local_1c0) {
                  local_1e8 = (void *)(local_40 * (long)local_1b0 + (long)local_f8.data);
                  local_1d0 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_1b0 *
                                       (local_1c8->weight_data_tm).elemsize +
                                      (long)(local_1c8->weight_data_tm).data);
                  local_1d8 = (pointer)0x0;
                  do {
                    if (0 < iVar42) {
                      local_1f0 = (void *)((long)local_1d8 * local_1a8 * local_148.elemsize);
                      uVar41 = 0;
                      do {
                        if (iVar38 < 1) {
                          iVar24 = 0;
                        }
                        else {
                          uVar22 = 0;
                          iVar24 = 0;
                          pvVar31 = local_1d0;
                          do {
                            if (0 < (int)uVar29) {
                              uVar45 = 0;
                              do {
                                auVar48._8_8_ = 0;
                                auVar48._0_8_ =
                                     *(ulong *)((long)local_148.data +
                                               (long)*(int *)(local_198._0_8_ + uVar45 * 4) * 8 +
                                               local_148.cstep * local_148.elemsize * uVar22 +
                                               (long)local_148.w * (long)local_1f0 +
                                               (long)(iVar36 * 8 * (int)uVar41));
                                auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar48);
                                auVar48 = vpunpcklbw_avx(auVar48,auVar47);
                                auVar50._8_8_ = 0;
                                auVar50._0_8_ = *(ulong *)((long)pvVar31 + uVar45 * 8);
                                auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar50);
                                auVar47 = vpunpcklbw_avx(auVar50,auVar47);
                                auVar55 = vpmullw_avx(auVar47,auVar48);
                                auVar47 = vpmulhw_avx(auVar48,auVar47);
                                auVar48 = vpunpcklwd_avx(auVar55,auVar47);
                                auVar47 = vpunpckhwd_avx(auVar55,auVar47);
                                auVar47 = vpaddd_avx(auVar48,auVar47);
                                auVar47 = vphaddd_avx(auVar47,auVar47);
                                auVar47 = vphaddd_avx(auVar47,auVar47);
                                iVar24 = iVar24 + auVar47._0_4_;
                                uVar45 = uVar45 + 1;
                              } while (uVar29 != uVar45);
                              pvVar31 = (void *)((long)pvVar31 + (long)local_1f8);
                            }
                            uVar22 = uVar22 + 1;
                          } while (uVar22 != uVar34);
                        }
                        *(int *)((long)local_1e8 + uVar41 * 4) = iVar24;
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar20);
                    }
                    local_1e8 = (void *)((long)local_1e8 + (long)local_1e0 * 4);
                    local_1d8 = (pointer)((long)local_1d8 + 1);
                  } while (local_1d8 != (pointer)local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != (Mat *)local_a8);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    iVar38 = local_f8.w;
    iVar24 = local_148.c;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 1)) {
      p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
      uVar35 = *(uint *)(p_Var2 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
      pvVar31 = (void *)(ulong)uVar35;
      if (pvVar31 == (void *)0x1) {
        if ((((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1)))) {
          conv1x1s1_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar35 != 1) ||
               ((*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) != 2))))
          goto LAB_00220ecf;
          conv1x1s2_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_00220ecf:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((uVar35 == 3 && (local_1b8->use_winograd23_convolution != false)) &&
             (*(int *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 3)))) &&
           (((((*(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data) == 1 &&
              (0xf < (int)local_98)))) &&
            (0xf < *(int *)(p_Var2 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data))))) {
          conv3x3s1_winograd23_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd23_data,local_1b8);
        }
        else {
          local_1d0 = (void *)(ulong)*(uint *)(p_Var2 + 0x38 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          iVar42 = *(int *)(p_Var2 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          local_1b0 = (Mat *)(long)*(int *)(p_Var2 + 0x40 +
                                           (long)&(local_1c8->weight_winograd23_data).data);
          iVar19 = *(int *)(p_Var2 + 0x44 + (long)&(local_1c8->weight_winograd23_data).data);
          lVar27 = (long)iVar19;
          local_1a8 = (ulong)*(int *)(p_Var2 + (long)&(local_1c8->weight_winograd43_data).data);
          local_1f0 = (void *)CONCAT44(local_1f0._4_4_,local_148.w);
          uVar34 = (ulong)(uint)local_148.c;
          pvVar44 = (void *)(long)local_f8.w;
          puVar40 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar29 = *(uint *)(p_Var2 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar35;
          local_1c0 = puVar40;
          if (local_1b8->use_sgemm_convolution == true) {
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)local_198,local_f8.h * local_f8.w,uVar29,local_148.c,1,1,
                        local_1b8->workspace_allocator);
            local_1a0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar24) {
              iVar24 = (int)local_1f0 * (int)local_1a8;
              local_1a8 = 0;
              do {
                if (0 < (int)local_1d0) {
                  local_1d8 = (pointer)((long)local_148.data +
                                       local_148.cstep * local_1a8 * local_148.elemsize);
                  piVar37 = (pointer)(local_158 * local_1a8 * local_198._16_8_ + local_198._0_8_);
                  local_1e0 = (Mat *)((long)local_148.w * local_148.elemsize * (long)local_1b0);
                  pvVar44 = (void *)0x0;
                  do {
                    local_1f0 = pvVar44;
                    if (0 < (int)uVar35) {
                      local_1f8 = (pointer)((long)local_1d8 + (long)local_1e0 * (long)local_1f0);
                      pvVar44 = (void *)0x0;
                      do {
                        if (0 < (int)puVar40) {
                          piVar25 = (pointer)((long)local_1f8 + (long)pvVar44 * (long)iVar42);
                          iVar36 = 0;
                          do {
                            if (iVar38 < 4) {
                              uVar29 = 0;
                            }
                            else {
                              iVar30 = 3;
                              do {
                                *(char *)piVar37 = (char)*piVar25;
                                *(undefined1 *)((long)piVar37 + 1) =
                                     *(undefined1 *)((long)piVar25 + lVar27);
                                *(undefined1 *)((long)piVar37 + 2) =
                                     *(undefined1 *)((long)piVar25 + (long)(iVar19 * 2));
                                *(undefined1 *)((long)piVar37 + 3) =
                                     *(undefined1 *)((long)piVar25 + (long)(iVar19 * 3));
                                piVar25 = piVar25 + lVar27;
                                piVar37 = piVar37 + 1;
                                iVar30 = iVar30 + 4;
                                uVar29 = iVar38 & 0xfffffffc;
                              } while (iVar30 < iVar38);
                            }
                            uVar39 = uVar29 | 1;
                            while ((int)uVar39 < iVar38) {
                              *(char *)piVar37 = (char)*piVar25;
                              *(undefined1 *)((long)piVar37 + 1) =
                                   *(undefined1 *)((long)piVar25 + lVar27);
                              piVar25 = (pointer)((long)piVar25 + (long)(iVar19 * 2));
                              piVar37 = (pointer)((long)piVar37 + 2);
                              uVar39 = uVar29 + 3;
                              uVar29 = uVar29 + 2;
                            }
                            if ((int)uVar29 < iVar38) {
                              iVar30 = iVar38 - uVar29;
                              do {
                                *(char *)piVar37 = (char)*piVar25;
                                piVar25 = (pointer)((long)piVar25 + lVar27);
                                piVar37 = (pointer)((long)piVar37 + 1);
                                iVar30 = iVar30 + -1;
                              } while (iVar30 != 0);
                            }
                            piVar25 = (pointer)((long)piVar25 + (long)(iVar24 - iVar38 * iVar19));
                            iVar36 = iVar36 + 1;
                            puVar40 = local_1c0;
                          } while (iVar36 != (int)local_1c0);
                        }
                        pvVar44 = (void *)((long)pvVar44 + 1);
                      } while (pvVar44 != pvVar31);
                    }
                    pvVar44 = (void *)((long)local_1f0 + 1U);
                  } while ((void *)((long)local_1f0 + 1U) != local_1d0);
                }
                local_1a8 = local_1a8 + 1;
                local_1e8 = pvVar31;
              } while (local_1a8 != uVar34);
            }
            im2col_sgemm_int8_sse((Mat *)local_198,&local_f8,local_1a0,local_1b8);
            piVar1 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if ((Allocator *)local_178._0_8_ == (Allocator *)0x0) {
                  if ((pointer)local_198._0_8_ != (pointer)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_178._0_8_)[3])();
                }
              }
            }
            local_158 = 0;
            local_198._0_8_ = (pointer)0x0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_198._16_8_ = (Allocator *)0x0;
            local_198._24_4_ = 0;
            local_178._0_28_ = ZEXT828((ulong)local_178._0_8_);
          }
          else {
            local_1a0 = (Mat *)(ulong)(uint)local_f8.c;
            local_1f8 = (pointer)(long)(int)uVar29;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_198,(size_type)local_1f8,
                       &local_1f9);
            if (0 < (int)local_1d0) {
              iVar19 = 0;
              iVar36 = 0;
              iVar30 = 0;
              do {
                if (0 < (int)uVar35) {
                  lVar33 = 0;
                  do {
                    *(int *)(local_198._0_8_ + (iVar19 + lVar33) * 4) = iVar30;
                    iVar30 = iVar30 + iVar42;
                    lVar33 = lVar33 + 1;
                  } while (uVar35 != (uint)lVar33);
                  iVar19 = iVar19 + (uint)lVar33;
                }
                iVar30 = iVar30 + ((int)local_1f0 * (int)local_1b0 - iVar42 * uVar35);
                iVar36 = iVar36 + 1;
              } while (iVar36 != (int)local_1d0);
            }
            if (0 < (int)local_1a0) {
              local_98 = local_f8.data;
              local_b0 = local_f8.elemsize * local_f8.cstep;
              local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,iVar24 * uVar29);
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)puVar40) {
                  local_208 = (void *)(local_b0 * (long)local_1b0 + (long)local_f8.data);
                  local_1d8 = (pointer)((long)(int)(iVar24 * uVar29 * (int)local_1b0) +
                                       (long)(local_1c8->weight_data_tm).data);
                  local_1e0 = (Mat *)0x0;
                  do {
                    if (0 < iVar38) {
                      local_1f0 = local_148.data;
                      local_1d0 = (void *)((long)local_1e0 * local_1a8 * local_148.elemsize);
                      pvVar31 = (void *)0x0;
                      do {
                        local_1e8 = pvVar31;
                        if (iVar24 < 1) {
                          iVar42 = 0;
                        }
                        else {
                          uVar20 = 0;
                          iVar42 = 0;
                          piVar37 = local_1d8;
                          do {
                            if (0 < (int)uVar29) {
                              uVar41 = 0;
                              do {
                                iVar42 = iVar42 + (int)*(char *)((long)piVar37 + uVar41) *
                                                  (int)*(char *)((long)local_148.data +
                                                                (long)*(int *)(local_198._0_8_ +
                                                                              uVar41 * 4) +
                                                                local_148.cstep * local_148.elemsize
                                                                * uVar20 +
                                                                (long)local_148.w * (long)local_1d0
                                                                + (long)local_1e8 * lVar27);
                                uVar41 = uVar41 + 1;
                              } while (uVar29 != uVar41);
                            }
                            piVar37 = (pointer)((long)local_1f8 + (long)piVar37);
                            uVar20 = uVar20 + 1;
                          } while (uVar20 != uVar34);
                        }
                        *(int *)((long)local_208 + (long)local_1e8 * 4) = iVar42;
                        pvVar31 = (void *)((long)local_1e8 + 1U);
                      } while ((void *)((long)local_1e8 + 1U) != pvVar44);
                    }
                    local_208 = (void *)((long)local_208 + (long)pvVar44 * 4);
                    local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                    puVar40 = local_1c0;
                  } while (local_1e0 != (Mat *)local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != local_1a0);
            }
            if ((pointer)local_198._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
            }
          }
        }
      }
    }
    p_Var2 = local_1c8->_vptr_Convolution_x86_fma[-3];
    if (local_8c < 0x65) {
      dequantize_from_int32
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(p_Var2 + 0x28 + (long)&(local_1c8->scale_in_data).data),local_1b8);
      pLVar3 = local_1c8->activation;
      iVar24 = 0;
      if (pLVar3 != (Layer *)0x0) {
        (*pLVar3->_vptr_Layer[9])(pLVar3,local_a0,local_1b8);
      }
    }
    else {
      iVar24 = 0;
      requantize_from_int32_to_int8
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(&local_1c8->field_0x280 + (long)p_Var2),
                 (Mat *)(p_Var2 + 0x28 + (long)&(local_1c8->scale_in_data).data),
                 *(int *)(p_Var2 + 0x24 + (long)&(local_1c8->weight_winograd43_data).data),
                 (Mat *)(p_Var2 + 0x28 + (long)&(local_1c8->weight_winograd43_data).data),local_1b8)
      ;
    }
  }
  piVar1 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
LAB_002215ed:
  piVar1 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  piVar1 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int Convolution_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}